

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall
Lowerer::LowerBailOnInvalidatedArrayLength(Lowerer *this,Instr *instr,bool isInHelperBlock)

{
  OpCode OVar1;
  Func *func;
  ArrayRegOpnd *this_00;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  undefined4 *puVar5;
  StackSym *pSVar6;
  StackSym *pSVar7;
  RegOpnd *pRVar8;
  Instr *pIVar9;
  Instr *this_01;
  undefined7 in_register_00000011;
  Opnd *pOVar10;
  LowererMD *this_02;
  undefined1 local_80 [8];
  AutoReuseOpnd autoReuseInvalidatedLengthOpnd;
  AutoReuseOpnd autoReuseLengthBeforeHelperCallOpnd;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_42;
  bool bStack_40;
  undefined4 uStack_3c;
  ValueType baseValueType;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3494,"(instr)","instr");
    if (!bVar3) goto LAB_005d113d;
    *puVar5 = 0;
  }
  OVar1 = instr->m_opcode;
  if (((1 < OVar1 - 0x203) && (OVar1 != StElemI_A)) && (OVar1 != StElemI_A_Strict)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3495,
                       "(instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict || instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy)"
                       ,
                       "instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict || instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy"
                      );
    if (!bVar3) goto LAB_005d113d;
    *puVar5 = 0;
  }
  pOVar10 = instr->m_dst;
  if (pOVar10 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3496,"(instr->GetDst())","instr->GetDst()");
    if (!bVar3) goto LAB_005d113d;
    *puVar5 = 0;
    pOVar10 = instr->m_dst;
  }
  OVar4 = IR::Opnd::GetKind(pOVar10);
  if (OVar4 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3497,"(instr->GetDst()->IsIndirOpnd())","instr->GetDst()->IsIndirOpnd()");
    if (!bVar3) goto LAB_005d113d;
    *puVar5 = 0;
  }
  func = instr->m_func;
  pOVar10 = instr->m_dst;
  OVar4 = IR::Opnd::GetKind(pOVar10);
  if (OVar4 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar3) goto LAB_005d113d;
    *puVar5 = 0;
  }
  _bStack_40 = (LabelInstr *)CONCAT44(uStack_3c,(int)CONCAT71(in_register_00000011,isInHelperBlock))
  ;
  this_00 = (ArrayRegOpnd *)pOVar10[1]._vptr_Opnd;
  local_42 = (this_00->super_RegOpnd).super_Opnd.m_valueType.field_0;
  bVar3 = ValueType::IsNotArray((ValueType *)&local_42.field_0);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x349d,"(!baseValueType.IsNotArray())","!baseValueType.IsNotArray()");
    if (!bVar3) goto LAB_005d113d;
    *puVar5 = 0;
  }
  bVar3 = IR::RegOpnd::IsArrayRegOpnd((RegOpnd *)this_00);
  if (bVar3) {
    bVar3 = IR::RegOpnd::IsArrayRegOpnd((RegOpnd *)this_00);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x24d,"(IsArrayRegOpnd())","IsArrayRegOpnd()");
      if (!bVar3) {
LAB_005d113d:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    autoReuseInvalidatedLengthOpnd.autoDelete = false;
    autoReuseInvalidatedLengthOpnd.wasInUse = false;
    autoReuseInvalidatedLengthOpnd._18_6_ = 0;
    pSVar6 = IR::ArrayRegOpnd::LengthSym(this_00);
    if (pSVar6 != (StackSym *)0x0) {
      pSVar6 = IR::ArrayRegOpnd::LengthSym(this_00);
      if (pSVar6 != this_00->headSegmentLengthSym) {
        pSVar6 = IR::ArrayRegOpnd::LengthSym(this_00);
        pSVar7 = IR::ArrayRegOpnd::LengthSym(this_00);
        pRVar8 = IR::RegOpnd::New(pSVar6,pSVar7->m_type,func);
        IR::AutoReuseOpnd::Initialize
                  ((AutoReuseOpnd *)&autoReuseInvalidatedLengthOpnd.autoDelete,&pRVar8->super_Opnd,
                   func,true);
        goto LAB_005d103a;
      }
    }
  }
  else {
    autoReuseInvalidatedLengthOpnd.autoDelete = false;
    autoReuseInvalidatedLengthOpnd.wasInUse = false;
    autoReuseInvalidatedLengthOpnd._18_6_ = 0;
  }
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,(Opnd *)this_00);
  pIVar9 = IR::Instr::New(Call,func);
  pRVar8 = IR::RegOpnd::New(TyUint32,func);
  IR::AutoReuseOpnd::Initialize
            ((AutoReuseOpnd *)&autoReuseInvalidatedLengthOpnd.autoDelete,&pRVar8->super_Opnd,func,
             true);
  IR::Instr::SetDst(pIVar9,&pRVar8->super_Opnd);
  IR::Instr::InsertBefore(instr,pIVar9);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,pIVar9,HelperArray_Jit_GetArrayLength,(LabelInstr *)0x0,(Opnd *)0x0,
             (PropertySymOpnd *)0x0,false);
LAB_005d103a:
  _bStack_40 = IR::Instr::GetOrCreateContinueLabel(instr,bStack_40);
  LowerOneBailOutKind(this,instr,BailOutOnInvalidatedArrayLength,false,false);
  pIVar9 = instr->m_next;
  this_02 = &this->m_lowererMD;
  LowererMD::LoadHelperArgument(this_02,pIVar9,(Opnd *)this_00);
  LowererMD::LoadHelperArgument(this_02,pIVar9,&pRVar8->super_Opnd);
  this_01 = IR::Instr::New(Call,func);
  pRVar8 = IR::RegOpnd::New(TyUint8,func);
  local_80 = (undefined1  [8])0x0;
  IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_80,&pRVar8->super_Opnd,func,true);
  IR::Instr::SetDst(this_01,&pRVar8->super_Opnd);
  IR::Instr::InsertBefore(pIVar9,this_01);
  LowererMD::ChangeToHelperCall
            (this_02,this_01,HelperArray_Jit_OperationInvalidatedArrayLength,(LabelInstr *)0x0,
             (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  InsertTest(&pRVar8->super_Opnd,&pRVar8->super_Opnd,pIVar9);
  InsertBranch(BrEq_A,false,_bStack_40,pIVar9);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_80);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseInvalidatedLengthOpnd.autoDelete);
  return;
}

Assistant:

void Lowerer::LowerBailOnInvalidatedArrayLength(IR::Instr *const instr, const bool isInHelperBlock)
{
    /*
        // Generate checks for whether the length changed during the helper call

        if(!(arrayOpnd && arrayOpnd.LengthSym() && arrayOpnd.LengthSym() != arrayOpnd.HeadSegmentLengthSym()))
        {
            // Record the array length before the helper call
            lengthBeforeHelperCall = Js::JavascriptArray::Jit_GetArrayLength(base)
        }

        helperCall:
            (Helper call and other bailout checks)

        // If the array has a different length after the helper call, then this store needs to bail out
        invalidatedLength = JavascriptArray::Jit_OperationInvalidatedArrayLength(lengthBeforeHelperCall, base)
        test invalidatedLength, invalidatedLength
        jz $skipBailOut

        (Bail out with IR::BailOutOnInvalidatedArrayLength)

        $skipBailOut:
    */

    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict || instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy);
    Assert(instr->GetDst());
    Assert(instr->GetDst()->IsIndirOpnd());

    Func *const func = instr->m_func;

    IR::RegOpnd *const baseOpnd = instr->GetDst()->AsIndirOpnd()->GetBaseOpnd();
    const ValueType baseValueType(baseOpnd->GetValueType());
    Assert(!baseValueType.IsNotArray());
    IR::ArrayRegOpnd *const arrayOpnd = baseOpnd->IsArrayRegOpnd() ? baseOpnd->AsArrayRegOpnd() : nullptr;

    IR::RegOpnd *lengthBeforeHelperCallOpnd;
    IR::AutoReuseOpnd autoReuseLengthBeforeHelperCallOpnd;
    if(arrayOpnd && arrayOpnd->LengthSym() && arrayOpnd->LengthSym() != arrayOpnd->HeadSegmentLengthSym())
    {
        lengthBeforeHelperCallOpnd = IR::RegOpnd::New(arrayOpnd->LengthSym(), arrayOpnd->LengthSym()->GetType(), func);
        autoReuseLengthBeforeHelperCallOpnd.Initialize(lengthBeforeHelperCallOpnd, func);
    }
    else
    {
        // Record the array length before the helper call
        //     lengthBeforeHelperCall = Js::JavascriptArray::Jit_GetArrayLength(base)
        m_lowererMD.LoadHelperArgument(instr, baseOpnd);
        IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, func);
        lengthBeforeHelperCallOpnd = IR::RegOpnd::New(TyUint32, func);
        autoReuseLengthBeforeHelperCallOpnd.Initialize(lengthBeforeHelperCallOpnd, func);
        callInstr->SetDst(lengthBeforeHelperCallOpnd);
        instr->InsertBefore(callInstr);
        m_lowererMD.ChangeToHelperCall(callInstr, IR::HelperArray_Jit_GetArrayLength);
    }

    IR::LabelInstr *const skipBailOutLabel = instr->GetOrCreateContinueLabel(isInHelperBlock);
    LowerOneBailOutKind(instr, IR::BailOutOnInvalidatedArrayLength, isInHelperBlock);
    IR::Instr *const insertBeforeInstr = instr->m_next;

    // If the array has a different length after the helper call, then this store needs to bail out
    //     invalidatedLength = JavascriptArray::Jit_OperationInvalidatedArrayLength(lengthBeforeHelperCall, base)
    m_lowererMD.LoadHelperArgument(insertBeforeInstr, baseOpnd);
    m_lowererMD.LoadHelperArgument(insertBeforeInstr, lengthBeforeHelperCallOpnd);
    IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, func);
    IR::RegOpnd *const invalidatedLengthOpnd = IR::RegOpnd::New(TyUint8, func);
    const IR::AutoReuseOpnd autoReuseInvalidatedLengthOpnd(invalidatedLengthOpnd, func);
    callInstr->SetDst(invalidatedLengthOpnd);
    insertBeforeInstr->InsertBefore(callInstr);
    m_lowererMD.ChangeToHelperCall(callInstr, IR::HelperArray_Jit_OperationInvalidatedArrayLength);

    //     test invalidatedLength, invalidatedLength
    //     jz $skipBailOut
    InsertTestBranch(
        invalidatedLengthOpnd,
        invalidatedLengthOpnd,
        Js::OpCode::BrEq_A,
        skipBailOutLabel,
        insertBeforeInstr);

    //     (Bail out with IR::BailOutOnInvalidatedArrayLength)
    //     $skipBailOut:
}